

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityKirchhoffIsothropic::ComputeStress
          (ChElasticityKirchhoffIsothropic *this,ChVector<double> *n,ChVector<double> *m,
          ChVector<double> *eps,ChVector<double> *kur,double z_inf,double z_sup,double angle)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = z_sup;
  auVar7._8_8_ = 0x8000000000000000;
  auVar7._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar11._0_16_,auVar7);
  if ((auVar7._0_8_ == z_inf) && (!NAN(auVar7._0_8_) && !NAN(z_inf))) {
    dVar6 = z_sup - z_inf;
    dVar1 = this->m_nu;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar1;
    auVar7 = vfnmadd231sd_fma(ZEXT816(0x3ff0000000000000),auVar12,auVar12);
    dVar16 = this->m_E / (dVar1 + 1.0 + dVar1 + 1.0);
    auVar10._0_8_ = (dVar6 * this->m_E) / auVar7._0_8_;
    auVar10._8_8_ = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = eps->m_data[0];
    auVar13._8_8_ = 0;
    auVar13._0_8_ = auVar10._0_8_ * dVar1 * eps->m_data[1];
    auVar7 = vfmadd231sd_fma(auVar13,auVar10,auVar2);
    auVar15._0_8_ = (dVar6 * dVar6 * auVar10._0_8_) / 12.0;
    auVar15._8_8_ = 0;
    n->m_data[0] = auVar7._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = eps->m_data[1];
    auVar14._8_8_ = 0;
    auVar14._0_8_ = auVar10._0_8_ * eps->m_data[0] * this->m_nu;
    auVar7 = vfmadd231sd_fma(auVar14,auVar10,auVar3);
    n->m_data[1] = auVar7._0_8_;
    n->m_data[2] = dVar6 * dVar16 * eps->m_data[2];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = kur->m_data[0];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = auVar15._0_8_ * this->m_nu * kur->m_data[1];
    auVar7 = vfmadd231sd_fma(auVar8,auVar15,auVar4);
    m->m_data[0] = auVar7._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = kur->m_data[1];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar15._0_8_ * this->m_nu * kur->m_data[0];
    auVar7 = vfmadd231sd_fma(auVar9,auVar15,auVar5);
    m->m_data[1] = auVar7._0_8_;
    m->m_data[2] = ((dVar6 * dVar6 * dVar6 * dVar16) / 12.0) * kur->m_data[2];
    return;
  }
  pow(z_sup,3.0);
  pow(z_inf,3.0);
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 3, 3, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 3, 3, 1>, Level = 1]"
               );
}

Assistant:

void ChElasticityKirchhoffIsothropic::ComputeStress(  ChVector<>& n,
                                                      ChVector<>& m,
                                                      const ChVector<>& eps,
                                                      const ChVector<>& kur,
                                                      const double z_inf,
                                                      const double z_sup,
                                                      const double angle) {
    if (z_inf == -z_sup) {
        // simplified computation for centered layer
        double h = z_sup - z_inf;
        double G = m_E / (2. * (1. + m_nu));
        double C = m_E * h / (1. - m_nu * m_nu);
        double D = C * h * h / 12.;
        double F = G * h * h * h / 12.;

        n.x() = eps.x() * C + eps.y() * m_nu * C;
		n.y() = eps.y() * C + eps.x() * m_nu * C;
        n.z() = eps.z() * G * h;

		m.x() = kur.x() * D + kur.y() * (m_nu * D);
		m.y() = kur.y() * D + kur.x() * (m_nu * D);
        m.z() = kur.z() * F;
    } else {
        double G = m_E / (2. * (1. + m_nu));
        double h1 = z_sup - z_inf;
        double h2 = 0.5 * (pow(z_sup, 2) - pow(z_inf, 2));
        double h3 = (1. / 3.) * (pow(z_sup, 3) - pow(z_inf, 3));
		ChMatrix33<> Q;
		Q(0, 0) = m_E / (1. - m_nu * m_nu);
		Q(0, 1) = m_nu * Q(0, 0);
		Q(0, 2) = 0;
		Q(1, 0) = Q(0, 1);
		Q(1, 1) = Q(0, 0);
		Q(1, 3) = 0;
		Q(2, 0) = 0;
		Q(2, 1) = 0;
		Q(2, 2) = G;
        n   = h1 * (Q * eps) + h2 * (Q * kur);
		m   = h2 * (Q * eps) + h3 * (Q * kur);
    }
}